

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  Enum EVar3;
  code *func;
  __off64_t *in_R8;
  size_t in_R9;
  ExprList new_exprs;
  
  new_exprs.size_ = 0;
  new_exprs.first_ = (Expr *)0x0;
  new_exprs.last_ = (Expr *)0x0;
LAB_001811c3:
  do {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsInstr(pair);
    if (bVar1) {
      RVar2 = ParseInstr(this,&new_exprs);
      if (RVar2.enum_ == Ok) {
LAB_0018121a:
        intrusive_list<wabt::Expr>::splice
                  (exprs,(int)exprs,(__off64_t *)0x0,(int)&new_exprs,in_R8,in_R9,
                   (uint)new_exprs.first_);
        goto LAB_001811c3;
      }
      func = anon_unknown_1::IsInstr;
    }
    else {
      if (pair._M_elems[0] != LparAnn) {
        EVar3 = Ok;
        goto LAB_00181233;
      }
      RVar2 = ParseCodeMetadataAnnotation(this,&new_exprs);
      if (RVar2.enum_ == Ok) goto LAB_0018121a;
      func = anon_unknown_1::IsLparAnn;
    }
    RVar2 = Synchronize(this,func);
    if (RVar2.enum_ == Error) {
      EVar3 = Error;
LAB_00181233:
      intrusive_list<wabt::Expr>::clear(&new_exprs);
      return (Result)EVar3;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (true) {
    auto pair = PeekPair();
    if (IsInstr(pair)) {
      if (Succeeded(ParseInstr(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsInstr));
      }
    } else if (IsLparAnn(pair)) {
      if (Succeeded(ParseCodeMetadataAnnotation(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsLparAnn));
      }
    } else {
      break;
    }
  }
  return Result::Ok;
}